

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,char *filename)

{
  FILE *__stream;
  
  Clear(this);
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    this->_errorID = XML_ERROR_FILE_NOT_FOUND;
    this->_errorStr1 = filename;
    this->_errorStr2 = (char *)0x0;
  }
  else {
    LoadFile(this,(FILE *)__stream);
    fclose(__stream);
  }
  return this->_errorID;
}

Assistant:

XMLError XMLDocument::LoadFile( const char* filename )
{
    Clear();
    FILE* fp = callfopen( filename, "rb" );
    if ( !fp ) {
        SetError( XML_ERROR_FILE_NOT_FOUND, filename, 0 );
        return _errorID;
    }
    LoadFile( fp );
    fclose( fp );
    return _errorID;
}